

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGNodeMatchesList(xmlNodePtr node,xmlRelaxNGDefinePtr_conflict *list)

{
  int iVar1;
  int local_2c;
  int tmp;
  int i;
  xmlRelaxNGDefinePtr_conflict cur;
  xmlRelaxNGDefinePtr_conflict *list_local;
  xmlNodePtr node_local;
  
  if ((node != (xmlNodePtr)0x0) && (list != (xmlRelaxNGDefinePtr_conflict *)0x0)) {
    _tmp = *list;
    local_2c = 1;
    while (_tmp != (xmlRelaxNGDefinePtr_conflict)0x0) {
      if ((node->type == XML_ELEMENT_NODE) && (_tmp->type == XML_RELAXNG_ELEMENT)) {
        iVar1 = xmlRelaxNGElementMatch((xmlRelaxNGValidCtxtPtr)0x0,_tmp,node);
        if (iVar1 == 1) {
          return 1;
        }
      }
      else if (((node->type == XML_TEXT_NODE) || (node->type == XML_CDATA_SECTION_NODE)) &&
              ((((_tmp->type == XML_RELAXNG_DATATYPE || (_tmp->type == XML_RELAXNG_LIST)) ||
                (_tmp->type == XML_RELAXNG_TEXT)) || (_tmp->type == XML_RELAXNG_VALUE)))) {
        return 1;
      }
      _tmp = list[local_2c];
      local_2c = local_2c + 1;
    }
  }
  return 0;
}

Assistant:

static int
xmlRelaxNGNodeMatchesList(xmlNodePtr node, xmlRelaxNGDefinePtr * list)
{
    xmlRelaxNGDefinePtr cur;
    int i = 0, tmp;

    if ((node == NULL) || (list == NULL))
        return (0);

    cur = list[i++];
    while (cur != NULL) {
        if ((node->type == XML_ELEMENT_NODE) &&
            (cur->type == XML_RELAXNG_ELEMENT)) {
            tmp = xmlRelaxNGElementMatch(NULL, cur, node);
            if (tmp == 1)
                return (1);
        } else if (((node->type == XML_TEXT_NODE) ||
                    (node->type == XML_CDATA_SECTION_NODE)) &&
                   ((cur->type == XML_RELAXNG_DATATYPE) ||
		    (cur->type == XML_RELAXNG_LIST) ||
                    (cur->type == XML_RELAXNG_TEXT) ||
                    (cur->type == XML_RELAXNG_VALUE))) {
            return (1);
        }
        cur = list[i++];
    }
    return (0);
}